

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

void do_note_off(_mdi *mdi,_event_data *data)

{
  long lVar1;
  ulong uVar2;
  _note *nte;
  uint uVar3;
  
  uVar3 = (uint)data->channel;
  uVar2 = (ulong)((data->data >> 8) * 0x50);
  lVar1 = uVar2 + uVar3 * 0x2800;
  nte = (_note *)((long)&mdi->note_table[0][0][0].noteid + uVar2 + uVar3 * 0x2800);
  if ((&mdi->note_table[0][0][0].active)[lVar1] == '\0') {
    nte = (_note *)((long)&mdi->note_table[1][0][0].noteid + lVar1);
  }
  if ((nte->active != '\0') &&
     (((&mdi->channel[0].isdrum)[uVar3 * 0x30] == '\0' || ((nte->modes & 4) != 0)))) {
    if (((nte->modes & 0x40) == 0) || (nte->env != '\0')) {
      do_note_off_extra(nte);
      return;
    }
    nte->is_off = '\x01';
  }
  return;
}

Assistant:

static void do_note_off(struct _mdi *mdi, struct _event_data *data) {
	struct _note *nte;
	unsigned char ch = data->channel;

	MIDI_EVENT_DEBUG(__FUNCTION__,ch);

	nte = &mdi->note_table[0][ch][(data->data >> 8)];
	if (!nte->active)
		nte = &mdi->note_table[1][ch][(data->data >> 8)];
	if (!nte->active) {
		return;
	}

	if ((mdi->channel[ch].isdrum) && (!(nte->modes & SAMPLE_LOOP))) {
		return;
	}

	if ((nte->modes & SAMPLE_ENVELOPE) && (nte->env == 0)) {
		// This is a fix for notes that end before the
		// initial step of the envelope has completed
		// making it impossible to hear them at times.
		nte->is_off = 1;
	} else {
		do_note_off_extra(nte);
	}
}